

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocumentContext.cpp
# Opt level: O2

void __thiscall
PDFHummus::DocumentContext::WriteReferenceState
          (DocumentContext *this,ObjectsContext *inStateWriter,ObjectReference *inReference)

{
  DictionaryContext *this_00;
  allocator<char> local_39;
  string local_38;
  
  this_00 = ObjectsContext::StartDictionary(inStateWriter);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"ObjectID",&local_39);
  DictionaryContext::WriteKey(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  DictionaryContext::WriteIntegerValue(this_00,inReference->ObjectID);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"GenerationNumber",&local_39);
  DictionaryContext::WriteKey(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  DictionaryContext::WriteIntegerValue(this_00,inReference->GenerationNumber);
  ObjectsContext::EndDictionary(inStateWriter,this_00);
  return;
}

Assistant:

void DocumentContext::WriteReferenceState(ObjectsContext* inStateWriter,
                                          const ObjectReference& inReference)
{
    DictionaryContext* referenceContext = inStateWriter->StartDictionary();

    referenceContext->WriteKey("ObjectID");
    referenceContext->WriteIntegerValue(inReference.ObjectID);

    referenceContext->WriteKey("GenerationNumber");
    referenceContext->WriteIntegerValue(inReference.GenerationNumber);

    inStateWriter->EndDictionary(referenceContext);
}